

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O0

bool __thiscall CGameControllerCTF::CanBeMovedOnBalance(CGameControllerCTF *this,int ClientID)

{
  CCharacter *pCVar1;
  CCharacter *pCVar2;
  IGameController *in_RDI;
  CFlag *F;
  int fi;
  CCharacter *Character;
  int local_24;
  
  IGameController::GameServer(in_RDI);
  pCVar1 = CPlayer::GetCharacter((CPlayer *)in_RDI);
  if (pCVar1 != (CCharacter *)0x0) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      if ((*(CFlag **)(in_RDI[1].m_aTeamSize + (long)local_24 * 2 + -8) != (CFlag *)0x0) &&
         (pCVar2 = CFlag::GetCarrier(*(CFlag **)(in_RDI[1].m_aTeamSize + (long)local_24 * 2 + -8)),
         pCVar2 == pCVar1)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool CGameControllerCTF::CanBeMovedOnBalance(int ClientID) const
{
	CCharacter* Character = GameServer()->m_apPlayers[ClientID]->GetCharacter();
	if(Character)
	{
		for(int fi = 0; fi < 2; fi++)
		{
			CFlag *F = m_apFlags[fi];
			if(F && F->GetCarrier() == Character)
				return false;
		}
	}
	return true;
}